

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void processILibs(string *config,cmGeneratorTarget *headTarget,cmLinkItem *item,
                 cmGlobalGenerator *gg,
                 vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *tgts
                 ,set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *emitted)

{
  bool bVar1;
  reference item_00;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar2;
  byte local_71;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_70;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_68;
  const_iterator it;
  cmLinkInterfaceLibraries *iface;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *emitted_local;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *tgts_local;
  cmGlobalGenerator *gg_local;
  cmLinkItem *item_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  
  local_71 = 0;
  if (item->Target != (cmGeneratorTarget *)0x0) {
    pVar2 = std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::insert(emitted,&item->Target);
    local_71 = pVar2.second;
  }
  if ((local_71 & 1) != 0) {
    std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
              (tgts,&item->Target);
    it._M_current =
         (cmLinkItem *)
         cmGeneratorTarget::GetLinkInterfaceLibraries(item->Target,config,headTarget,true);
    if (it._M_current != (cmLinkItem *)0x0) {
      local_68._M_current =
           (cmLinkItem *)
           std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                     ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)it._M_current);
      while( true ) {
        local_70._M_current =
             (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(it._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_68,&local_70);
        if (!bVar1) break;
        item_00 = __gnu_cxx::
                  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                  ::operator*(&local_68);
        processILibs(config,headTarget,item_00,gg,tgts,emitted);
        __gnu_cxx::
        __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
        ::operator++(&local_68);
      }
    }
  }
  return;
}

Assistant:

void processILibs(const std::string& config,
                  cmGeneratorTarget const* headTarget,
                  cmLinkItem const& item,
                  cmGlobalGenerator* gg,
                  std::vector<cmGeneratorTarget const*>& tgts,
                  std::set<cmGeneratorTarget const*>& emitted)
{
  if (item.Target && emitted.insert(item.Target).second)
    {
    tgts.push_back(item.Target);
    if(cmLinkInterfaceLibraries const* iface =
       item.Target->GetLinkInterfaceLibraries(config, headTarget, true))
      {
      for(std::vector<cmLinkItem>::const_iterator
            it = iface->Libraries.begin();
          it != iface->Libraries.end(); ++it)
        {
        processILibs(config, headTarget, *it, gg, tgts, emitted);
        }
      }
    }
}